

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_1_to_2_phase_0
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int src_w,
               int src_h,int16_t *coef,uint8_t *temp_buffer)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  __m128i *extraout_XMM0_Qa_00;
  int16_t *in_stack_00000008;
  __m128i ab;
  __m128i b;
  __m128i a;
  __m128i CD;
  __m128i D;
  __m128i C;
  __m128i s [8];
  int x;
  __m128i f [4];
  uint8_t *tmp [9];
  int y;
  int max_width;
  longlong *in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd1;
  undefined1 in_stack_fffffffffffffcd2;
  undefined1 in_stack_fffffffffffffcd3;
  undefined1 in_stack_fffffffffffffcd4;
  undefined1 in_stack_fffffffffffffcd5;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  __m128i *in_stack_fffffffffffffcd8;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  __m128i *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  uint8_t *in_stack_fffffffffffffd30;
  uint8_t *in_stack_fffffffffffffd38;
  int local_27c;
  longlong local_278 [8];
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  int local_1e8;
  uint local_1e4;
  int local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_180;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  uint8_t *local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_1e4 = in_R8D + 7U & 0xfffffff8;
  local_238 = ab[0];
  local_230 = ab[0] + (int)local_1e4;
  local_228 = ab[0] + (int)(local_1e4 << 1);
  local_220 = ab[0] + (int)(local_1e4 * 3);
  local_218 = ab[0] + (int)(local_1e4 << 2);
  local_210 = ab[0] + (int)(local_1e4 * 5);
  local_208 = ab[0] + (int)(local_1e4 * 6);
  local_200 = ab[0] + (int)(local_1e4 * 7);
  local_1e0 = in_R9D;
  local_1d8 = in_RCX;
  local_1d0 = in_RDX;
  local_1c8 = in_RSI;
  local_1c0 = in_RDI;
  shuffle_filter_ssse3(in_stack_00000008,(__m128i *)local_278);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  scale_1_to_2_phase_0_row
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
  local_1e8 = local_1e0;
  do {
    scale_1_to_2_phase_0_row
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20);
    uStack_164 = in_stack_fffffffffffffcd0;
    uStack_174 = in_stack_fffffffffffffcd1;
    uStack_163 = in_stack_fffffffffffffcd2;
    uStack_173 = in_stack_fffffffffffffcd3;
    uStack_162 = in_stack_fffffffffffffcd4;
    uStack_172 = in_stack_fffffffffffffcd5;
    uStack_161 = in_stack_fffffffffffffcd6;
    uStack_171 = in_stack_fffffffffffffcd7;
    for (local_27c = 0; local_27c < (int)local_1e4; local_27c = local_27c + 8) {
      local_8 = (undefined8 *)(local_1c0 + local_27c);
      local_18 = *local_8;
      uStack_10 = 0;
      local_20 = (undefined8 *)(local_220 + local_27c);
      local_38 = *local_20;
      uStack_30 = 0;
      uStack_140 = 0;
      uStack_150 = 0;
      local_148._0_1_ = (undefined1)local_18;
      local_148._1_1_ = (undefined1)((ulong)local_18 >> 8);
      local_148._2_1_ = (undefined1)((ulong)local_18 >> 0x10);
      local_148._3_1_ = (undefined1)((ulong)local_18 >> 0x18);
      local_148._4_1_ = (undefined1)((ulong)local_18 >> 0x20);
      local_148._5_1_ = (undefined1)((ulong)local_18 >> 0x28);
      local_148._6_1_ = (undefined1)((ulong)local_18 >> 0x30);
      local_148._7_1_ = (undefined1)((ulong)local_18 >> 0x38);
      local_158._0_1_ = (undefined1)local_38;
      local_158._1_1_ = (undefined1)((ulong)local_38 >> 8);
      local_158._2_1_ = (undefined1)((ulong)local_38 >> 0x10);
      local_158._3_1_ = (undefined1)((ulong)local_38 >> 0x18);
      local_158._4_1_ = (undefined1)((ulong)local_38 >> 0x20);
      local_158._5_1_ = (undefined1)((ulong)local_38 >> 0x28);
      local_158._6_1_ = (undefined1)((ulong)local_38 >> 0x30);
      local_158._7_1_ = (undefined1)((ulong)local_38 >> 0x38);
      local_180 = (undefined8 *)(local_1d0 + local_27c * 2);
      local_198 = CONCAT17(local_158._3_1_,
                           CONCAT16(local_148._3_1_,
                                    CONCAT15(local_158._2_1_,
                                             CONCAT14(local_148._2_1_,
                                                      CONCAT13(local_158._1_1_,
                                                               CONCAT12(local_148._1_1_,
                                                                        CONCAT11((undefined1)
                                                                                 local_158,
                                                                                 (undefined1)
                                                                                 local_148)))))));
      uStack_190 = CONCAT17(local_158._7_1_,
                            CONCAT16(local_148._7_1_,
                                     CONCAT15(local_158._6_1_,
                                              CONCAT14(local_148._6_1_,
                                                       CONCAT13(local_158._5_1_,
                                                                CONCAT12(local_148._5_1_,
                                                                         CONCAT11(local_158._4_1_,
                                                                                  local_148._4_1_)))
                                                      ))));
      *local_180 = local_198;
      local_180[1] = uStack_190;
      local_158 = local_38;
      local_148 = local_18;
      load_8bit_8x8((uint8_t *)in_stack_fffffffffffffc90,(ptrdiff_t)&local_308,(__m128i *)0x7a4648);
      in_stack_fffffffffffffc90 = local_278;
      scale_1_to_2_phase_0_kernel
                (in_stack_fffffffffffffcd8,
                 (__m128i *)
                 CONCAT17(uStack_171,
                          CONCAT16(uStack_161,
                                   CONCAT15(uStack_172,
                                            CONCAT14(uStack_162,
                                                     CONCAT13(uStack_173,
                                                              CONCAT12(uStack_163,
                                                                       CONCAT11(uStack_174,
                                                                                uStack_164))))))));
      local_40 = (undefined8 *)(local_238 + local_27c);
      local_308 = *local_40;
      uStack_50 = 0;
      uStack_300 = 0;
      local_60 = (undefined8 *)(local_230 + local_27c);
      local_2f8 = *local_60;
      uStack_70 = 0;
      uStack_2f0 = 0;
      local_80 = (undefined8 *)(local_228 + local_27c);
      local_2e8 = *local_80;
      uStack_90 = 0;
      in_stack_fffffffffffffd20 = (__m128i *)0x0;
      local_a0 = (undefined8 *)(local_220 + local_27c);
      in_stack_fffffffffffffd28 = *local_a0;
      uStack_b0 = 0;
      in_stack_fffffffffffffd30 = (uint8_t *)0x0;
      local_c0 = (undefined8 *)(local_218 + local_27c);
      in_stack_fffffffffffffd38 = (uint8_t *)*local_c0;
      uStack_d0 = 0;
      local_e0 = (undefined8 *)(local_210 + local_27c);
      local_f8 = *local_e0;
      uStack_f0 = 0;
      local_100 = (undefined8 *)(local_208 + local_27c);
      local_118 = *local_100;
      uStack_110 = 0;
      local_120 = (undefined8 *)(local_200 + local_27c);
      local_138 = *local_120;
      uStack_130 = 0;
      local_d8 = in_stack_fffffffffffffd38;
      local_b8 = in_stack_fffffffffffffd28;
      local_98 = local_2e8;
      local_78 = local_2f8;
      local_58 = local_308;
      scale_1_to_2_phase_0_kernel
                (in_stack_fffffffffffffcd8,
                 (__m128i *)
                 CONCAT17(uStack_171,
                          CONCAT16(uStack_161,
                                   CONCAT15(uStack_172,
                                            CONCAT14(uStack_162,
                                                     CONCAT13(uStack_173,
                                                              CONCAT12(uStack_163,
                                                                       CONCAT11(uStack_174,
                                                                                uStack_164))))))));
      local_168 = (undefined1)extraout_XMM0_Qa;
      uStack_167 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
      uStack_166 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_165 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
      uStack_164 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_163 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_162 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_161 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
      local_178 = SUB81(extraout_XMM0_Qa_00,0);
      uStack_177 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
      uStack_176 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      uStack_175 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
      uStack_174 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      uStack_173 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
      uStack_172 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      uStack_171 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
      local_1a0 = (undefined8 *)(local_1d0 + local_1d8 + (long)(local_27c << 1));
      local_1b8 = CONCAT17(uStack_175,
                           CONCAT16(uStack_165,
                                    CONCAT15(uStack_176,
                                             CONCAT14(uStack_166,
                                                      CONCAT13(uStack_177,
                                                               CONCAT12(uStack_167,
                                                                        CONCAT11(local_178,local_168
                                                                                )))))));
      uStack_1b0 = CONCAT17(uStack_171,
                            CONCAT16(uStack_161,
                                     CONCAT15(uStack_172,
                                              CONCAT14(uStack_162,
                                                       CONCAT13(uStack_173,
                                                                CONCAT12(uStack_163,
                                                                         CONCAT11(uStack_174,
                                                                                  uStack_164)))))));
      *local_1a0 = local_1b8;
      local_1a0[1] = uStack_1b0;
      in_stack_fffffffffffffcd8 = extraout_XMM0_Qa_00;
    }
    local_1c0 = local_1c8 + local_1c0;
    local_1d0 = local_1d8 * 2 + local_1d0;
    local_1f8 = local_238;
    lVar1 = local_230;
    local_230 = local_228;
    local_228 = local_220;
    local_220 = local_218;
    local_218 = local_210;
    local_210 = local_208;
    local_208 = local_200;
    local_200 = local_238;
    local_1e8 = local_1e8 + -1;
    in_stack_fffffffffffffcd0 = uStack_164;
    in_stack_fffffffffffffcd1 = uStack_174;
    in_stack_fffffffffffffcd2 = uStack_163;
    in_stack_fffffffffffffcd3 = uStack_173;
    in_stack_fffffffffffffcd4 = uStack_162;
    in_stack_fffffffffffffcd5 = uStack_172;
    in_stack_fffffffffffffcd6 = uStack_161;
    in_stack_fffffffffffffcd7 = uStack_171;
    local_238 = lVar1;
  } while (local_1e8 != 0);
  return;
}

Assistant:

static void scale_plane_1_to_2_phase_0(const uint8_t *src,
                                       const ptrdiff_t src_stride, uint8_t *dst,
                                       const ptrdiff_t dst_stride,
                                       const int src_w, const int src_h,
                                       const int16_t *const coef,
                                       uint8_t *const temp_buffer) {
  int max_width;
  int y;
  uint8_t *tmp[9];
  __m128i f[4];

  max_width = (src_w + 7) & ~7;
  tmp[0] = temp_buffer + 0 * max_width;
  tmp[1] = temp_buffer + 1 * max_width;
  tmp[2] = temp_buffer + 2 * max_width;
  tmp[3] = temp_buffer + 3 * max_width;
  tmp[4] = temp_buffer + 4 * max_width;
  tmp[5] = temp_buffer + 5 * max_width;
  tmp[6] = temp_buffer + 6 * max_width;
  tmp[7] = temp_buffer + 7 * max_width;

  shuffle_filter_ssse3(coef, f);

  scale_1_to_2_phase_0_row(src - 3 * src_stride - 3, tmp[0], max_width, f);
  scale_1_to_2_phase_0_row(src - 2 * src_stride - 3, tmp[1], max_width, f);
  scale_1_to_2_phase_0_row(src - 1 * src_stride - 3, tmp[2], max_width, f);
  scale_1_to_2_phase_0_row(src + 0 * src_stride - 3, tmp[3], max_width, f);
  scale_1_to_2_phase_0_row(src + 1 * src_stride - 3, tmp[4], max_width, f);
  scale_1_to_2_phase_0_row(src + 2 * src_stride - 3, tmp[5], max_width, f);
  scale_1_to_2_phase_0_row(src + 3 * src_stride - 3, tmp[6], max_width, f);

  y = src_h;
  do {
    int x;
    scale_1_to_2_phase_0_row(src + 4 * src_stride - 3, tmp[7], max_width, f);
    for (x = 0; x < max_width; x += 8) {
      __m128i s[8], C, D, CD;

      // Even rows
      const __m128i a = _mm_loadl_epi64((const __m128i *)(src + x));
      const __m128i b = _mm_loadl_epi64((const __m128i *)(tmp[3] + x));
      const __m128i ab = _mm_unpacklo_epi8(a, b);
      _mm_storeu_si128((__m128i *)(dst + 2 * x), ab);

      // Odd rows
      // Even columns
      load_8bit_8x8(src + x - 3 * src_stride, src_stride, s);
      C = scale_1_to_2_phase_0_kernel(s, f);

      // Odd columns
      s[0] = _mm_loadl_epi64((const __m128i *)(tmp[0] + x));
      s[1] = _mm_loadl_epi64((const __m128i *)(tmp[1] + x));
      s[2] = _mm_loadl_epi64((const __m128i *)(tmp[2] + x));
      s[3] = _mm_loadl_epi64((const __m128i *)(tmp[3] + x));
      s[4] = _mm_loadl_epi64((const __m128i *)(tmp[4] + x));
      s[5] = _mm_loadl_epi64((const __m128i *)(tmp[5] + x));
      s[6] = _mm_loadl_epi64((const __m128i *)(tmp[6] + x));
      s[7] = _mm_loadl_epi64((const __m128i *)(tmp[7] + x));
      D = scale_1_to_2_phase_0_kernel(s, f);

      CD = _mm_unpacklo_epi8(C, D);
      _mm_storeu_si128((__m128i *)(dst + dst_stride + 2 * x), CD);
    }

    src += src_stride;
    dst += 2 * dst_stride;
    tmp[8] = tmp[0];
    tmp[0] = tmp[1];
    tmp[1] = tmp[2];
    tmp[2] = tmp[3];
    tmp[3] = tmp[4];
    tmp[4] = tmp[5];
    tmp[5] = tmp[6];
    tmp[6] = tmp[7];
    tmp[7] = tmp[8];
  } while (--y);
}